

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_sort(kvtree *hash,int direction)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  void *pvVar3;
  kvtree_elem_struct *pkVar4;
  ulong uVar5;
  code *__compar;
  long *plVar6;
  size_t size;
  uint uVar7;
  size_t __nmemb;
  sort_elem_str *list;
  void *local_30;
  
  if (hash == (kvtree *)0x0) {
    __nmemb = 0;
    local_30 = kvtree_malloc(0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                             ,0x23e);
  }
  else {
    pkVar4 = hash->lh_first;
    if (pkVar4 == (kvtree_elem_struct *)0x0) {
      __nmemb = 0;
      local_30 = kvtree_malloc(0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                               ,0x23e);
    }
    else {
      size = 0;
      __nmemb = 0;
      do {
        pkVar4 = (pkVar4->pointers).le_next;
        __nmemb = __nmemb + 1;
        size = size + 0x10;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
      local_30 = kvtree_malloc(size,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                               ,0x23e);
      if (hash == (kvtree *)0x0) goto LAB_00104543;
    }
    pkVar4 = hash->lh_first;
    if (pkVar4 != (kvtree_elem_struct *)0x0) {
      plVar6 = (long *)((long)local_30 + 8);
      uVar7 = 0;
      do {
        plVar6[-1] = (long)pkVar4->key;
        *plVar6 = (long)pkVar4;
        pkVar4 = (pkVar4->pointers).le_next;
        plVar6 = plVar6 + 2;
        uVar7 = uVar7 + 1;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
      goto LAB_00104546;
    }
  }
LAB_00104543:
  uVar7 = 0;
LAB_00104546:
  pvVar3 = local_30;
  __compar = kvtree_cmp_fn_str_asc;
  if (direction == 1) {
    __compar = kvtree_cmp_fn_str_desc;
  }
  qsort(local_30,__nmemb,0x10,__compar);
  if (0 < (int)uVar7) {
    uVar5 = (ulong)uVar7 + 1;
    plVar6 = (long *)((long)pvVar3 + (ulong)uVar7 * 0x10 + -8);
    do {
      pkVar4 = (kvtree_elem_struct *)*plVar6;
      pkVar1 = (pkVar4->pointers).le_next;
      ppkVar2 = (pkVar4->pointers).le_prev;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = ppkVar2;
      }
      *ppkVar2 = pkVar1;
      pkVar1 = hash->lh_first;
      (pkVar4->pointers).le_next = pkVar1;
      if (pkVar1 != (kvtree_elem_struct *)0x0) {
        (pkVar1->pointers).le_prev = &(pkVar4->pointers).le_next;
      }
      hash->lh_first = pkVar4;
      (pkVar4->pointers).le_prev = &hash->lh_first;
      uVar5 = uVar5 - 1;
      plVar6 = plVar6 + -2;
    } while (1 < uVar5);
  }
  kvtree_free(&local_30);
  return 0;
}

Assistant:

int kvtree_sort(kvtree* hash, int direction)
{
  /* get the size of the hash */
  int count = kvtree_size(hash);

  /* allocate space for each element */
  struct sort_elem_str* list = (struct sort_elem_str*) KVTREE_MALLOC(count * sizeof(struct sort_elem_str));

  /* walk the hash and fill in the keys */
  kvtree_elem* elem = NULL;
  int index = 0;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    char* key = kvtree_elem_key(elem);
    list[index].key = key;
    list[index].addr = elem;
    index++;
  }

  /* sort the elements by key */
  int (*fn)(const void* a, const void* b) = NULL;
  fn = &kvtree_cmp_fn_str_asc;
  if (direction == KVTREE_SORT_DESCENDING) {
    fn = &kvtree_cmp_fn_str_desc;
  }
  qsort(list, count, sizeof(struct sort_elem_str), fn);

  /* walk the sorted list backwards, extracting the element by address,
   * and inserting at the head */
  while (index > 0) {
    index--;
    elem = list[index].addr;
    LIST_REMOVE(elem, pointers);
    LIST_INSERT_HEAD(hash, elem, pointers);
  }

  /* free the list */
  kvtree_free(&list);

  return KVTREE_SUCCESS;
}